

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<signed_char,unsigned_long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  unsigned_long_long u2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  char t;
  unsigned_long_long u;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffdf8;
  undefined5 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe05;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe06;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe07;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe18;
  char local_19;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_b;
  byte local_a;
  char local_9;
  unsigned_long_long local_8;
  
  local_8 = 0;
  local_9 = 0;
  local_a = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long_long *)in_stack_fffffffffffffdf8.m_int);
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_18,&local_8);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_long_long>
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int);
  local_a = (local_a ^ 0xff) & 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (char *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (unsigned_long_long *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int);
  local_b.m_int = local_19;
  SafeInt::operator_cast_to_unsigned_long_long
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator*(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe08.m_int);
  rhs.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs);
  local_8 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_00.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_00.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_00.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_00);
  local_8 = 1;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator/(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe08.m_int);
  i.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  i.m_int._0_6_ = in_stack_fffffffffffffe10;
  i.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,i);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator+(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_01.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_01.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_01.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_01);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  local_8 = 0;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator-(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  rhs_02.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_02.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_02.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_02);
  local_8 = 1;
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator<<('\0',in_stack_fffffffffffffdf8);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  bits.m_int._5_1_ = in_stack_fffffffffffffe05;
  bits.m_int._0_5_ = in_stack_fffffffffffffe00;
  bits.m_int._6_1_ = in_stack_fffffffffffffe06.m_int;
  bits.m_int._7_1_ = in_stack_fffffffffffffe07.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,bits);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator>>('\0',in_stack_fffffffffffffdf8);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  bits_00.m_int._5_1_ = in_stack_fffffffffffffe05;
  bits_00.m_int._0_5_ = in_stack_fffffffffffffe00;
  bits_00.m_int._6_1_ = in_stack_fffffffffffffe06.m_int;
  bits_00.m_int._7_1_ = in_stack_fffffffffffffe07.m_int;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,bits_00);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator&(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_03.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_03.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_03.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_03);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator|(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_04.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_04.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_04.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_04);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe07.m_int,
                                 CONCAT16(in_stack_fffffffffffffe06.m_int,
                                          CONCAT15(in_stack_fffffffffffffe05,
                                                   in_stack_fffffffffffffe00))));
  operator^(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_signed_char
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8.m_int);
  rhs_05.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_05.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_05.m_int._7_1_ = in_stack_fffffffffffffe17;
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffe08.m_int,rhs_05);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator<(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator<(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator<=(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator<=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator>(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator>(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8.m_int);
  local_a = operator>=(in_stack_fffffffffffffdf8.m_int,in_stack_fffffffffffffe07);
  local_a = operator>=(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  local_a = operator==(in_stack_fffffffffffffe07,in_stack_fffffffffffffdf8);
  lhs.m_int = local_b.m_int;
  local_a = operator==(local_b,in_stack_fffffffffffffdf8.m_int);
  local_a = operator==(in_stack_fffffffffffffdf8.m_int,lhs);
  operator==(lhs,local_18);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}